

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintInt32
          (FastFieldValuePrinter *this,int32_t val,BaseTextGenerator *generator)

{
  char *pcVar1;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  char *local_48;
  long local_40;
  char local_38 [32];
  
  local_48 = local_38;
  pcVar1 = FastInt32ToBufferLeft(val,local_38);
  local_40 = (long)pcVar1 - (long)local_38;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,local_48,local_48 + local_40);
  (*generator->_vptr_BaseTextGenerator[5])(generator,local_68,local_60);
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintInt32(
    int32_t val, BaseTextGenerator* generator) const {
  generator->PrintString(StrCat(val));
}